

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# koch_snowflake.c
# Opt level: O3

int main(int argc,char **argv)

{
  GLfloat (*paGVar1) [2];
  ulong uVar2;
  double dVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  bool bVar9;
  int iVar10;
  int iVar11;
  bov_window_t *window;
  GLfloat (*coords) [2];
  GLuint *elements;
  bov_points_t *points;
  bov_order_t *order;
  ulong uVar12;
  bov_text_t *text;
  ulong uVar13;
  GLuint GVar14;
  long lVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar26;
  GLfloat aGVar25 [2];
  float local_7c;
  GLubyte local_58 [40];
  
  window = bov_window_new(0x400,0x280,*argv);
  window->backgroundColor[0] = 0.3;
  window->backgroundColor[1] = 0.3;
  window->backgroundColor[2] = 0.3;
  window->backgroundColor[3] = 1.0;
  coords = (GLfloat (*) [2])malloc(0x2008);
  elements = (GLuint *)malloc(0x100c);
  iVar11 = 0;
  points = bov_points_new((GLfloat (*) [2])0x0,0x401,0x88e4);
  order = bov_order_new((GLuint *)0x0,0x403,0x88e8);
  *coords = (GLfloat  [2])0xbdcccccdbf2b851e;
  coords[0x400] = (GLfloat  [2])0xbdcccccd3f2b851e;
  (points->param).fillColor[0] = 0.7;
  (points->param).fillColor[1] = 0.5;
  (points->param).fillColor[2] = 0.0;
  (points->param).fillColor[3] = 2.0;
  (points->param).outlineColor[0] = 1.0;
  (points->param).outlineColor[1] = 1.0;
  (points->param).outlineColor[2] = 1.0;
  (points->param).outlineColor[3] = 1.0;
  local_7c = 0.33;
  uVar13 = 1;
  do {
    auVar8 = _DAT_0011d060;
    auVar7 = _DAT_0011d050;
    uVar2 = uVar13 * 4;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = uVar2;
    *elements = 0;
    auVar17._8_4_ = (int)uVar13;
    auVar17._0_8_ = uVar13;
    auVar17._12_4_ = (int)(uVar13 >> 0x20);
    auVar18._0_8_ = uVar13 << 2;
    auVar18._8_8_ = auVar17._8_8_ << 2;
    iVar10 = SUB164((ZEXT816(0) << 0x40 | ZEXT816(0x400)) / auVar21,0);
    auVar18 = auVar18 ^ auVar8;
    GVar14 = 0;
    lVar15 = 0;
    do {
      auVar20._8_4_ = (int)lVar15;
      auVar20._0_8_ = lVar15;
      auVar20._12_4_ = (int)((ulong)lVar15 >> 0x20);
      auVar21 = (auVar20 | auVar7) ^ auVar8;
      if ((bool)(~(auVar21._4_4_ == auVar18._4_4_ && auVar18._0_4_ < auVar21._0_4_ ||
                  auVar18._4_4_ < auVar21._4_4_) & 1)) {
        elements[lVar15 + 1] = GVar14;
      }
      if ((auVar21._12_4_ != auVar18._12_4_ || auVar21._8_4_ <= auVar18._8_4_) &&
          auVar21._12_4_ <= auVar18._12_4_) {
        elements[lVar15 + 2] = GVar14 + iVar10;
      }
      lVar15 = lVar15 + 2;
      GVar14 = GVar14 + iVar10 * 2;
    } while (uVar13 * 4 + 2 != lVar15);
    elements[uVar13 * 4 + 2] = 0x400;
    bov_order_update(order,elements,(uint)uVar2 | 3);
    dVar3 = window->wtime;
    dVar19 = dVar3;
    while (dVar19 = dVar19 - dVar3, dVar19 < 1.3) {
      fVar22 = (float)(dVar19 / 1.3);
      uVar12 = 0;
      do {
        uVar4 = elements[uVar12 * 4 + 1];
        uVar5 = elements[uVar12 * 4 + 2];
        paGVar1 = coords + elements[uVar12 * 4 + 3];
        uVar6 = elements[uVar12 * 4 + 4];
        fVar24 = SUB84(coords[elements[uVar12 * 4 + 5]],0) - SUB84(coords[uVar4],0);
        fVar26 = SUB84(coords[elements[uVar12 * 4 + 5]],4) - SUB84(coords[uVar4],4);
        lVar15 = 0;
        fVar23 = fVar24;
        bVar9 = true;
        do {
          bVar16 = bVar9;
          coords[uVar5][lVar15] =
               (1.0 - fVar22) * 0.25 * fVar23 + (fVar22 / 3.0) * fVar23 + coords[uVar4][lVar15];
          (*paGVar1)[lVar15] = fVar23 * 0.5 + coords[uVar4][lVar15];
          coords[uVar6][lVar15] =
               fVar23 * (1.0 - fVar22) * 0.75 +
               ((fVar22 + fVar22) / 3.0) * fVar23 + coords[uVar4][lVar15];
          lVar15 = 1;
          fVar23 = fVar26;
          bVar9 = false;
        } while (bVar16);
        aGVar25[1] = SUB84(*paGVar1,4) + fVar24 * fVar22 * 0.28867513;
        aGVar25[0] = SUB84(*paGVar1,0) + fVar26 * -(fVar22 * 0.28867513);
        *paGVar1 = aGVar25;
        uVar12 = uVar12 + 1;
      } while (uVar12 != uVar13);
      bov_points_update(points,coords,0x401);
      fVar23 = (fVar22 * local_7c + fVar22 * local_7c) / -3.0 + local_7c;
      fVar22 = 1.5 / (fVar23 + 0.67);
      (points->param).scale[0] = fVar22;
      (points->param).scale[1] = fVar22;
      fVar23 = fVar23 * fVar22;
      (points->param).width = fVar23;
      (points->param).outlineWidth = fVar23 * 0.66;
      bov_points_draw_with_order_aux(window,points,CURVE_PROGRAM,order,0,0x7fffffff);
      bov_window_update(window);
      dVar19 = window->wtime;
      iVar10 = glfwWindowShouldClose(window->self);
      if (iVar10 != 0) goto LAB_0010602e;
    }
    local_7c = local_7c * 0.33333334;
    iVar11 = iVar11 + 1;
    uVar13 = uVar2;
  } while (iVar11 != 4);
  builtin_memcpy(local_58 + 0x10,"evel reached",0xd);
  builtin_memcpy(local_58,"Max. iteration l",0x10);
  text = bov_text_new(local_58,0x88e4);
  (text->param).fillColor[0] = 0.0;
  (text->param).fillColor[1] = 0.0;
  (text->param).fillColor[2] = 0.0;
  (text->param).fillColor[3] = 0.0;
  (text->param).outlineColor[0] = 1.0;
  (text->param).outlineColor[1] = 1.0;
  (text->param).outlineColor[2] = 1.0;
  (text->param).outlineColor[3] = 1.0;
  (text->param).pos[0] = 64.0;
  (text->param).pos[1] = 64.0;
  (text->param).shift[0] = 0.0;
  (text->param).shift[1] = 0.0;
  (text->param).fontSize = 64.0;
  (text->param).boldness = 0.3;
  (text->param).outlineWidth = 1.0;
  (text->param).spaceType = PIXEL_SPACE;
  local_7c = (local_7c * -0.0 + local_7c * -0.0) / 3.0 + local_7c;
  fVar22 = 1.5 / (local_7c + 0.67);
  (points->param).scale[0] = fVar22;
  (points->param).scale[1] = fVar22;
  local_7c = local_7c * fVar22;
  (points->param).width = local_7c;
  (points->param).outlineWidth = local_7c * 0.66;
  bov_points_update(points,coords,0x401);
  while (iVar11 = glfwWindowShouldClose(window->self), iVar11 == 0) {
    bov_points_draw_with_order_aux(window,points,CURVE_PROGRAM,order,0,0x7fffffff);
    bov_text_draw(window,text);
    bov_window_update_and_wait_events(window);
  }
  bov_text_delete(text);
LAB_0010602e:
  bov_order_delete(order);
  free(elements);
  bov_points_delete(points);
  free(coords);
  bov_window_delete(window);
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
	bov_window_t* window = bov_window_new(1024, 640, argv[0]);
	bov_window_set_color(window, (GLfloat[4]) {0.3, 0.3, 0.3, 1.0});

	const int maxIters = 5;
	const size_t maxSegment = 1ULL << (2 * maxIters); // 4^maxIter with bits operations
	const size_t maxPoints = maxSegment + 1;

	// allocations
	GLfloat (*coords)[2] = malloc(2 * sizeof(GLfloat) * maxPoints);
	GLuint* indices = malloc(sizeof(GLuint) * (maxPoints + 2));
	bov_points_t* pointset = bov_points_new(NULL, maxPoints, GL_STATIC_DRAW); // GPU mirror of coords
	bov_order_t* order = bov_order_new(NULL, maxPoints + 2, GL_DYNAMIC_DRAW); // GPU mirror of indices

	// initialization
	size_t nSegment = 1;                // nPoints = nSegment+1
	GLfloat segWidth = ORIGINAL_SEGWIDTH; // the width of each segments

	coords[0][0] = -1.0 + segWidth;
	coords[0][1] = -0.1;
	coords[maxSegment][0] = 1.0 - segWidth;
	coords[maxSegment][1] = -0.1;

	// we set those parameters once and for all, other parameters
	// will be updated during the animation
	GLfloat fillColor[4] = {1, 1, 1, 1};
	GLfloat outColor[4] = {0.7, 0.5, 0.0, 2.0};
	bov_points_set_color(pointset, outColor);
	bov_points_set_outline_color(pointset, fillColor);

	// iterations
	for(int i=0; i<maxIters-1; i++) {
		indices_update(indices, 4 * nSegment, maxSegment);
		bov_order_update(order, indices, 4 * nSegment + 3);

		// animation (here we recompute the points each times)
		double tbegin = bov_window_get_time(window);
		double tnow = tbegin;
		while(tnow - tbegin < TRANSITION_TIME) {
			// interpolation factor
			GLfloat s = (tnow - tbegin)/TRANSITION_TIME;

			coords_update(coords, indices, nSegment, s);
			bov_points_update(pointset, coords, maxPoints);
			parameters_update(pointset, segWidth, s);

			bov_curve_draw_with_order(window, pointset, order, 0, BOV_TILL_END);
			bov_window_update(window);

			tnow = bov_window_get_time(window);

			if(bov_window_should_close(window))
				goto end_of_program;
		}

		nSegment *= 4;
		segWidth *= 1.0 / 3.0;
	}

	bov_text_t* end = bov_text_new((GLubyte[]){"Max. iteration level reached"}, GL_STATIC_DRAW);
	bov_text_set_param(end, (bov_text_param_t) {
	  .spaceType = PIXEL_SPACE,
	  .fontSize = 64,
	  .pos = {64, 64},
	  .fillColor = {0},          // transparent
	  .outlineColor = {1, 1, 1, 1}, // white
	  .boldness = 0.3,
	  .outlineWidth = 1.0
	});

	parameters_update(pointset, segWidth, 0);
	bov_points_update(pointset, coords, maxPoints);

	while(!bov_window_should_close(window)) {
		bov_curve_draw_with_order(window, pointset, order, 0, BOV_TILL_END);
		bov_text_draw(window, end);
		bov_window_update_and_wait_events(window);
	}

	bov_text_delete(end);

end_of_program:

	bov_order_delete(order);
	free(indices);
	bov_points_delete(pointset);
	free(coords);
	bov_window_delete(window);

	return EXIT_SUCCESS;
}